

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O0

void av1_convolve_x_sr_avx2(void)

{
  undefined1 auVar1 [32];
  __m128i res_00;
  __m256i src;
  __m256i src_00;
  __m256i res_01;
  __m256i res_02;
  __m256i data_00;
  __m256i data_01;
  __m256i data_02;
  __m256i data_03;
  __m256i data_04;
  __m256i data_05;
  __m256i data_06;
  __m256i data_07;
  __m256i data_08;
  __m256i data_09;
  __m256i data_10;
  __m256i data_11;
  __m256i data_12;
  __m256i data_13;
  __m256i data_14;
  __m256i data_15;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  undefined4 uVar6;
  undefined8 *puVar7;
  int in_ECX;
  ulong stride;
  __m256i *in_RDX;
  int in_ESI;
  long lVar8;
  undefined1 (*in_RDI) [16];
  undefined1 (*pauVar9) [16];
  undefined1 *puVar10;
  int in_R8D;
  int in_R9D;
  undefined8 uVar11;
  __m256i *res_03;
  undefined8 uVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar15;
  ptrdiff_t pVar16;
  undefined8 uVar17;
  undefined1 in_ZMM0 [64];
  __m128i src_01;
  __m128i res_04;
  __m128i src_02;
  __m128i src_03;
  __m128i src_04;
  __m128i src_05;
  __m128i res_05;
  __m128i src_06;
  __m128i alVar18;
  __m128i s;
  __m128i v;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m256i r_6 [2];
  __m256i res_8;
  uint8_t *src_ptr_3;
  __m256i r_5 [2];
  __m256i res_7;
  uint8_t *src_ptr_2;
  __m256i filt_256_2 [4];
  __m128i res_6;
  __m256i res_8b_1;
  __m256i res_16b_1;
  __m256i data_1;
  int j;
  int i_1;
  __m256i filt_256_1 [2];
  __m128i res_1;
  __m128i res_0;
  __m256i res_8b;
  __m256i res_16b;
  __m256i data;
  int i;
  __m256i filt_256 [2];
  __m128i r_4;
  __m128i res_5;
  __m128i r_3;
  __m128i res_4;
  uint8_t *src_ptr_1;
  __m128i d1_1;
  __m128i d0_1;
  __m128i s11_1;
  __m128i s10_1;
  __m128i s01_1;
  __m128i s00_1;
  __m128i d1;
  __m128i d0;
  __m128i s11;
  __m128i s01;
  __m128i s10;
  __m128i s00;
  __m128i d_2;
  __m128i s1_1;
  __m128i s_128_1;
  __m128i d_1;
  __m128i s1;
  __m128i s_128;
  __m256i r_2 [2];
  __m128i d;
  __m128i res_3 [2];
  __m128i r_1;
  __m128i res_2;
  __m128i r;
  __m128i res;
  uint8_t *src_ptr;
  int horz_tap_1;
  __m256i coeffs_256 [4];
  __m128i coeffs_128 [4];
  int32_t y;
  __m256i r_7 [2];
  __m256i r_9 [2];
  __m256i r_8 [2];
  __m256i r_13 [2];
  __m256i r_12 [2];
  __m256i r_11 [2];
  __m256i r_10 [2];
  __m256i s1_256_3;
  __m256i s0_256_3;
  __m256i s1_256_4;
  __m256i s0_256_4;
  __m256i s1_256_5;
  __m256i s0_256_5;
  __m256i s1_256_6;
  __m256i s0_256_6;
  __m256i s1_256_1;
  __m256i s0_256_1;
  __m256i s1_256_2;
  __m256i s0_256_2;
  __m256i s1_256;
  __m256i s0_256;
  __m256i *in_stack_ffffffffffffef40;
  undefined4 in_stack_ffffffffffffef48;
  int in_stack_ffffffffffffef4c;
  InterpFilterParams *in_stack_ffffffffffffef50;
  int32_t subpel_q4;
  undefined4 in_stack_ffffffffffffef70;
  __m256i *in_stack_ffffffffffffef80;
  __m256i *in_stack_ffffffffffffef88;
  __m256i *in_stack_ffffffffffffef90;
  ptrdiff_t dst_stride;
  undefined4 in_stack_ffffffffffffef98;
  int in_stack_ffffffffffffef9c;
  undefined4 uVar19;
  InterpFilterParams *in_stack_ffffffffffffefa0;
  undefined4 in_stack_ffffffffffffefa8;
  int32_t in_stack_ffffffffffffefac;
  InterpFilterParams *in_stack_ffffffffffffefb0;
  __m256i *in_stack_ffffffffffffefb8;
  __m256i *in_stack_ffffffffffffefc0;
  __m256i *in_stack_ffffffffffffefc8;
  __m256i *in_stack_ffffffffffffefd0;
  longlong in_stack_ffffffffffffefd8;
  undefined1 in_stack_ffffffffffffefe0 [24];
  undefined8 *local_1008;
  uint8_t local_f80 [8];
  uint8_t auStack_f78 [8];
  uint8_t auStack_f70 [8];
  uint8_t auStack_f68 [8];
  uint8_t local_f60 [8];
  uint8_t auStack_f58 [8];
  uint8_t auStack_f50 [8];
  uint8_t auStack_f48 [8];
  uint8_t local_f40 [8];
  uint8_t auStack_f38 [8];
  uint8_t auStack_f30 [8];
  uint8_t auStack_f28 [8];
  __m256i *local_f20;
  uint8_t auStack_f18 [8];
  uint8_t auStack_f10 [8];
  uint8_t auStack_f08 [24];
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined1 local_ee0 [32];
  undefined1 local_ec0 [16];
  undefined1 auStack_eb0 [16];
  undefined1 local_ea0 [32];
  int local_e68;
  int local_e64;
  uint8_t local_e60 [8];
  uint8_t auStack_e58 [8];
  uint8_t auStack_e50 [8];
  uint8_t auStack_e48 [8];
  uint8_t local_e40 [8];
  uint8_t auStack_e38 [8];
  uint8_t auStack_e30 [8];
  uint8_t auStack_e28 [8];
  undefined8 local_e20;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined1 local_e00 [32];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  int local_d84;
  uint8_t local_d80 [8];
  uint8_t auStack_d78 [8];
  uint8_t auStack_d70 [8];
  uint8_t auStack_d68 [8];
  uint8_t local_d60 [8];
  uint8_t auStack_d58 [8];
  uint8_t auStack_d50 [8];
  uint8_t auStack_d48 [24];
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [16];
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [16];
  undefined1 *local_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  longlong local_cd0;
  longlong lStack_cc8;
  undefined8 local_c80;
  longlong local_c70;
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_b80 [16];
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [16];
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [16];
  undefined1 (*local_b10) [16];
  int local_b04;
  undefined1 local_b00 [212];
  int local_a2c;
  uint local_a1c;
  int local_a0c;
  int local_a08;
  int local_a04;
  __m256i *local_a00;
  int local_9f4;
  undefined1 (*local_9f0) [16];
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  undefined1 (*local_9a8) [16];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [16];
  undefined1 auStack_930 [16];
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 *local_868;
  longlong local_860;
  undefined8 uStack_858;
  __m256i *local_848;
  undefined8 *local_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 *local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_790;
  undefined8 uStack_788;
  uint8_t *local_778;
  uint8_t *local_770;
  undefined1 (*local_768) [32];
  uint8_t *local_760;
  uint8_t *local_758;
  undefined8 in_stack_fffffffffffff8b0;
  int h;
  undefined8 in_stack_fffffffffffff8b8;
  uint8_t *in_stack_fffffffffffff8c0;
  undefined8 in_stack_fffffffffffff8c8;
  int src_stride;
  uint8_t *in_stack_fffffffffffff8d0;
  undefined8 local_640 [8];
  __m256i *local_600;
  uint8_t *local_5f8;
  undefined1 *local_5f0;
  undefined8 *local_5e8;
  undefined8 local_5e0 [8];
  __m256i *local_5a0;
  uint8_t *local_598;
  undefined1 *local_590;
  undefined8 *local_588;
  undefined8 local_580 [8];
  __m256i *local_540;
  uint8_t *local_538;
  undefined1 *local_530;
  undefined8 *local_528;
  undefined8 local_520 [8];
  __m256i *local_4e0;
  uint8_t *local_4d8;
  undefined1 *local_4d0;
  undefined8 *local_4c8;
  undefined8 local_4c0 [8];
  __m256i *local_480;
  uint8_t *local_478;
  undefined1 *local_470;
  undefined8 *local_468;
  undefined8 local_460 [8];
  __m256i *local_420;
  uint8_t *local_418;
  undefined1 *local_410;
  undefined8 *local_408;
  undefined8 local_400 [8];
  __m256i *local_3c0;
  uint8_t *local_3b8;
  undefined1 *local_3b0;
  undefined8 *local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 *local_350;
  uint8_t *local_348;
  undefined1 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2d0;
  uint8_t *local_2c8;
  undefined1 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 *local_250;
  uint8_t *local_248;
  undefined1 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1d0;
  uint8_t *local_1c8;
  undefined1 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 *local_150;
  uint8_t *local_148;
  undefined1 *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 *local_d0;
  uint8_t *local_c8;
  undefined1 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 *local_60;
  uint8_t *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  src_stride = (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
  h = (int)((ulong)in_stack_fffffffffffff8b0 >> 0x20);
  iVar5 = get_filter_tap(in_stack_ffffffffffffef50,in_stack_ffffffffffffef4c);
  if (iVar5 == 0xc) {
    av1_convolve_x_sr_general_avx2
              (in_stack_fffffffffffff8d0,src_stride,in_stack_fffffffffffff8c0,
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,h,
               (InterpFilterParams *)CONCAT44(in_stack_ffffffffffffef4c,in_stack_00000010),
               in_stack_00000018,(ConvolveParams *)CONCAT44(in_R9D,0xc));
  }
  else {
    stride = (ulong)in_stack_00000010;
    local_a1c = in_stack_00000010;
    local_a2c = in_R9D;
    local_a0c = in_R9D;
    local_a08 = in_R8D;
    local_a04 = in_ECX;
    local_a00 = in_RDX;
    local_9f4 = in_ESI;
    local_9f0 = in_RDI;
    local_b04 = get_filter_tap(in_stack_ffffffffffffef50,in_stack_ffffffffffffef4c);
    subpel_q4 = (int32_t)((ulong)in_RDX >> 0x20);
    if (local_b04 == 2) {
      local_b10 = local_9f0;
      if (local_a1c == 8) {
        if (local_a08 == 2) {
          local_b04 = 2;
          do {
            auVar12 = in_ZMM0._0_16_;
            load_u8_4x2_sse4_1((uint8_t *)
                               CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48),
                               (ptrdiff_t)in_stack_ffffffffffffef40);
            local_be0 = vpsrldq_avx(auVar12,1);
            local_bf0 = vpavgb_avx(auVar12,local_be0);
            local_7b0 = local_bf0._0_8_;
            uStack_7a8 = local_bf0._8_8_;
            local_7c0 = local_bf0._0_8_;
            uStack_7b8 = local_bf0._8_8_;
            *(short *)*local_a00 = local_bf0._0_2_;
            in_ZMM0 = ZEXT1664(local_bf0);
            uVar6 = vpextrw_avx(local_bf0,2);
            *(short *)((long)*local_a00 + (long)local_a04) = (short)uVar6;
            local_b10 = (undefined1 (*) [16])(*local_b10 + (local_9f4 << 1));
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
            local_bd0 = auVar12;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 4) {
          local_b04 = 2;
          do {
            auVar12 = in_ZMM0._0_16_;
            lVar8 = (long)local_9f4;
            alVar18 = load_u8_8x2_sse2((uint8_t *)
                                       CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48)
                                       ,(ptrdiff_t)in_stack_ffffffffffffef40);
            v[1] = alVar18[1];
            local_c10 = vpsrldq_avx(auVar12,1);
            local_c20 = vpavgb_avx(auVar12,local_c10);
            in_ZMM0 = ZEXT1664(local_c20);
            v[0] = lVar8;
            local_c00 = auVar12;
            xx_storel_32(local_a00,v);
            *(undefined4 *)((long)*local_a00 + (long)local_a04) = local_c20._8_4_;
            local_b10 = (undefined1 (*) [16])(*local_b10 + (local_9f4 << 1));
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 8) {
          do {
            auVar12 = vpsrldq_avx(*local_b10,1);
            auVar13 = vpsrldq_avx(*(undefined1 (*) [16])(*local_b10 + local_9f4),1);
            auVar12 = vpavgb_avx(*local_b10,auVar12);
            auVar13 = vpavgb_avx(*(undefined1 (*) [16])(*local_b10 + local_9f4),auVar13);
            local_c70 = auVar12._0_8_;
            (*local_a00)[0] = local_c70;
            local_c80 = auVar13._0_8_;
            *(undefined8 *)((long)*local_a00 + (long)local_a04) = local_c80;
            local_b10 = (undefined1 (*) [16])(*local_b10 + (local_9f4 << 1));
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x10) {
          do {
            auVar12 = vpavgb_avx(*local_b10,*(undefined1 (*) [16])(*local_b10 + 1));
            auVar13 = vpavgb_avx(*(undefined1 (*) [16])(*local_b10 + local_9f4),
                                 *(undefined1 (*) [16])(*local_b10 + (long)local_9f4 + 1));
            local_cd0 = auVar12._0_8_;
            lStack_cc8 = auVar12._8_8_;
            (*local_a00)[0] = local_cd0;
            (*local_a00)[1] = lStack_cc8;
            puVar7 = (undefined8 *)((long)*local_a00 + (long)local_a04);
            local_ce0 = auVar13._0_8_;
            uStack_cd8 = auVar13._8_8_;
            *puVar7 = local_ce0;
            puVar7[1] = uStack_cd8;
            local_b10 = (undefined1 (*) [16])(*local_b10 + (local_9f4 << 1));
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x20) {
          local_b04 = 2;
          do {
            sr_x_2tap_32_avg_avx2
                      ((uint8_t *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            local_b10 = (undefined1 (*) [16])(*local_b10 + local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x40) {
          local_b04 = 2;
          do {
            sr_x_2tap_32_avg_avx2
                      ((uint8_t *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            sr_x_2tap_32_avg_avx2
                      ((uint8_t *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            local_b10 = (undefined1 (*) [16])(*local_b10 + local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
        else {
          local_b04 = 2;
          do {
            sr_x_2tap_32_avg_avx2
                      ((uint8_t *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            sr_x_2tap_32_avg_avx2
                      ((uint8_t *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            sr_x_2tap_32_avg_avx2
                      ((uint8_t *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            sr_x_2tap_32_avg_avx2
                      ((uint8_t *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            local_b10 = (undefined1 (*) [16])(*local_b10 + local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
      }
      else if (local_a08 < 9) {
        prepare_half_coeffs_2tap_ssse3
                  ((InterpFilterParams *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),subpel_q4,
                   (__m128i *)CONCAT44(in_ECX,in_R8D));
        if (local_a08 == 2) {
          do {
            auVar12 = in_ZMM0._0_16_;
            lVar8 = (long)local_9f4;
            pauVar9 = local_b10;
            x_convolve_2tap_2x2_sse4_1
                      ((uint8_t *)in_stack_ffffffffffffef90,(ptrdiff_t)in_stack_ffffffffffffef88,
                       (__m128i *)in_stack_ffffffffffffef80);
            local_b20._0_8_ = auVar12._0_8_;
            local_b20._8_8_ = auVar12._8_8_;
            src_01[1] = lVar8;
            src_01[0] = (longlong)pauVar9;
            uVar11 = local_b20._0_8_;
            uVar14 = local_b20._8_8_;
            local_b20 = auVar12;
            alVar18 = sr_x_round_sse2(src_01);
            in_ZMM0 = ZEXT1664(CONCAT88(uVar14,uVar11));
            res_04[1] = (long)local_a04;
            res_04[0] = (longlong)local_a00;
            local_b30 = uVar11;
            uStack_b28 = uVar14;
            pack_store_2x2_sse2(res_04,alVar18[1],stride);
            local_b10 = (undefined1 (*) [16])(*local_b10 + (local_9f4 << 1));
            stride = (ulong)(local_a04 << 1);
            local_a00 = (__m256i *)((long)*local_a00 + stride);
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 4) {
          do {
            auVar12 = in_ZMM0._0_16_;
            lVar8 = (long)local_9f4;
            pauVar9 = local_b10;
            x_convolve_2tap_4x2_ssse3
                      ((uint8_t *)in_stack_ffffffffffffef90,(ptrdiff_t)in_stack_ffffffffffffef88,
                       (__m128i *)in_stack_ffffffffffffef80);
            local_b40._0_8_ = auVar12._0_8_;
            local_b40._8_8_ = auVar12._8_8_;
            src_02[1] = lVar8;
            src_02[0] = (longlong)pauVar9;
            uVar11 = local_b40._0_8_;
            uVar14 = local_b40._8_8_;
            local_b40 = auVar12;
            sr_x_round_sse2(src_02);
            in_ZMM0 = ZEXT1664(CONCAT88(uVar14,uVar11));
            res_00[0]._4_4_ = in_R9D;
            res_00[0]._0_4_ = iVar5;
            res_00[1]._0_4_ = in_R8D;
            res_00[1]._4_4_ = in_ECX;
            local_b50 = uVar11;
            uStack_b48 = uVar14;
            pack_store_4x2_sse2(res_00,(uint8_t *)in_stack_ffffffffffffef50,
                                CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48));
            local_b10 = (undefined1 (*) [16])(*local_b10 + (local_9f4 << 1));
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else {
          do {
            lVar8 = (long)local_9f4;
            pauVar9 = local_b10;
            x_convolve_2tap_8x2_ssse3
                      ((uint8_t *)in_stack_ffffffffffffefb0,
                       CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8),
                       (__m128i *)in_stack_ffffffffffffefa0,
                       (__m128i *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
            src_03[1] = lVar8;
            src_03[0] = (longlong)pauVar9;
            sr_x_round_sse2(src_03);
            src_04[1] = lVar8;
            src_04[0] = (longlong)pauVar9;
            alVar18 = sr_x_round_sse2(src_04);
            s[1] = alVar18[1];
            local_790 = local_b70;
            uStack_788 = uStack_b68;
            auVar13._8_8_ = uStack_b68;
            auVar13._0_8_ = local_b70;
            auVar12._8_8_ = uStack_b58;
            auVar12._0_8_ = local_b60;
            local_b80 = vpackuswb_avx(auVar13,auVar12);
            local_848 = local_a00;
            local_860 = local_b80._0_8_;
            uStack_858 = local_b80._8_8_;
            (*local_a00)[0] = local_b80._0_8_;
            s[0] = lVar8;
            _mm_storeh_epi64((__m128i *)((long)*local_a00 + (long)local_a04),s);
            local_b10 = (undefined1 (*) [16])(*local_b10 + (local_9f4 << 1));
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
      }
      else {
        prepare_half_coeffs_2tap_avx2
                  (in_stack_ffffffffffffefb0,in_stack_ffffffffffffefac,
                   (__m256i *)in_stack_ffffffffffffefa0);
        if (local_a08 == 0x10) {
          do {
            x_convolve_2tap_16x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffefd0,(ptrdiff_t)in_stack_ffffffffffffefc8,
                       in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
            sr_x_round_store_16x2_avx2
                      ((__m256i *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                       (ptrdiff_t)in_stack_ffffffffffffef90);
            local_b10 = (undefined1 (*) [16])(*local_b10 + (local_9f4 << 1));
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x20) {
          do {
            sr_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              (uint8_t *)in_stack_ffffffffffffef90);
            local_b10 = (undefined1 (*) [16])(*local_b10 + local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x40) {
          do {
            sr_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              (uint8_t *)in_stack_ffffffffffffef90);
            sr_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              (uint8_t *)in_stack_ffffffffffffef90);
            local_b10 = (undefined1 (*) [16])(*local_b10 + local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
        else {
          do {
            sr_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              (uint8_t *)in_stack_ffffffffffffef90);
            sr_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              (uint8_t *)in_stack_ffffffffffffef90);
            sr_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              (uint8_t *)in_stack_ffffffffffffef90);
            sr_x_2tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              (uint8_t *)in_stack_ffffffffffffef90);
            local_b10 = (undefined1 (*) [16])(*local_b10 + local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
      }
    }
    else if (local_b04 == 4) {
      local_ce8 = local_9f0[-1] + 0xf;
      prepare_half_coeffs_4tap_ssse3
                ((InterpFilterParams *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),subpel_q4,
                 (__m128i *)CONCAT44(in_ECX,in_R8D));
      if (local_a08 == 2) {
        do {
          auVar12 = in_ZMM0._0_16_;
          lVar8 = (long)local_9f4;
          puVar10 = local_ce8;
          x_convolve_4tap_2x2_ssse3
                    ((uint8_t *)in_stack_ffffffffffffefb0,
                     CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8),
                     (__m128i *)in_stack_ffffffffffffefa0);
          local_d00._0_8_ = auVar12._0_8_;
          local_d00._8_8_ = auVar12._8_8_;
          src_05[1] = lVar8;
          src_05[0] = (longlong)puVar10;
          uVar11 = local_d00._0_8_;
          uVar14 = local_d00._8_8_;
          local_d00 = auVar12;
          alVar18 = sr_x_round_sse2(src_05);
          in_ZMM0 = ZEXT1664(CONCAT88(uVar14,uVar11));
          res_05[1] = (long)local_a04;
          res_05[0] = (longlong)local_a00;
          local_d10 = uVar11;
          uStack_d08 = uVar14;
          pack_store_2x2_sse2(res_05,alVar18[1],stride);
          local_ce8 = local_ce8 + (local_9f4 << 1);
          stride = (ulong)(local_a04 << 1);
          local_a00 = (__m256i *)((long)*local_a00 + stride);
          local_a2c = local_a2c + -2;
        } while (local_a2c != 0);
      }
      else if (local_a08 == 4) {
        do {
          auVar12 = in_ZMM0._0_16_;
          lVar8 = (long)local_9f4;
          puVar10 = local_ce8;
          x_convolve_4tap_4x2_ssse3
                    ((uint8_t *)in_stack_ffffffffffffefb0,
                     CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8),
                     (__m128i *)in_stack_ffffffffffffefa0);
          local_d20._0_8_ = auVar12._0_8_;
          local_d20._8_8_ = auVar12._8_8_;
          src_06[1] = lVar8;
          src_06[0] = (longlong)puVar10;
          uVar11 = local_d20._0_8_;
          uVar14 = local_d20._8_8_;
          local_d20 = auVar12;
          sr_x_round_sse2(src_06);
          in_ZMM0 = ZEXT1664(CONCAT88(uVar14,uVar11));
          alVar18[0]._4_4_ = in_R9D;
          alVar18[0]._0_4_ = iVar5;
          alVar18[1]._0_4_ = in_R8D;
          alVar18[1]._4_4_ = in_ECX;
          local_d30 = uVar11;
          uStack_d28 = uVar14;
          pack_store_4x2_sse2(alVar18,(uint8_t *)in_stack_ffffffffffffef50,
                              CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48));
          local_ce8 = local_ce8 + (local_9f4 << 1);
          local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
          local_a2c = local_a2c + -2;
        } while (local_a2c != 0);
      }
      else if (local_a08 == 8) {
        prepare_coeffs_lowbd
                  (in_stack_ffffffffffffefa0,in_stack_ffffffffffffef9c,in_stack_ffffffffffffef90);
        local_770 = "";
        local_d80[0] = '\0';
        local_d80[1] = '\x01';
        local_d80[2] = '\x01';
        local_d80[3] = '\x02';
        local_d80[4] = '\x02';
        local_d80[5] = '\x03';
        local_d80[6] = '\x03';
        local_d80[7] = '\x04';
        auStack_d78[0] = '\x04';
        auStack_d78[1] = '\x05';
        auStack_d78[2] = '\x05';
        auStack_d78[3] = '\x06';
        auStack_d78[4] = '\x06';
        auStack_d78[5] = '\a';
        auStack_d78[6] = '\a';
        auStack_d78[7] = '\b';
        auStack_d70[0] = '\0';
        auStack_d70[1] = '\x01';
        auStack_d70[2] = '\x01';
        auStack_d70[3] = '\x02';
        auStack_d70[4] = '\x02';
        auStack_d70[5] = '\x03';
        auStack_d70[6] = '\x03';
        auStack_d70[7] = '\x04';
        auStack_d68[0] = '\x04';
        auStack_d68[1] = '\x05';
        auStack_d68[2] = '\x05';
        auStack_d68[3] = '\x06';
        auStack_d68[4] = '\x06';
        auStack_d68[5] = '\a';
        auStack_d68[6] = '\a';
        auStack_d68[7] = '\b';
        local_778 = 
        "\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n"
        ;
        local_d60[0] = '\x02';
        local_d60[1] = '\x03';
        local_d60[2] = '\x03';
        local_d60[3] = '\x04';
        local_d60[4] = '\x04';
        local_d60[5] = '\x05';
        local_d60[6] = '\x05';
        local_d60[7] = '\x06';
        auStack_d58[0] = '\x06';
        auStack_d58[1] = '\a';
        auStack_d58[2] = '\a';
        auStack_d58[3] = '\b';
        auStack_d58[4] = '\b';
        auStack_d58[5] = '\t';
        auStack_d58[6] = '\t';
        auStack_d58[7] = '\n';
        auStack_d50[0] = '\x02';
        auStack_d50[1] = '\x03';
        auStack_d50[2] = '\x03';
        auStack_d50[3] = '\x04';
        auStack_d50[4] = '\x04';
        auStack_d50[5] = '\x05';
        auStack_d50[6] = '\x05';
        auStack_d50[7] = '\x06';
        auStack_d48[0] = '\x06';
        auStack_d48[1] = '\a';
        auStack_d48[2] = '\a';
        auStack_d48[3] = '\b';
        auStack_d48[4] = '\b';
        auStack_d48[5] = '\t';
        auStack_d48[6] = '\t';
        auStack_d48[7] = '\n';
        for (local_d84 = 0; local_d84 < local_a0c; local_d84 = local_d84 + 2) {
          local_9b0 = (undefined8 *)(local_ce8 + local_d84 * local_9f4);
          uVar11 = *local_9b0;
          uVar14 = local_9b0[1];
          local_9b8 = (undefined8 *)(local_ce8 + (local_d84 * local_9f4 + local_9f4));
          uVar15 = *local_9b8;
          uVar17 = local_9b8[1];
          data_00[0]._4_4_ = in_stack_ffffffffffffef9c;
          data_00[0]._0_4_ = in_stack_ffffffffffffef98;
          data_00[1] = (longlong)in_stack_ffffffffffffefa0;
          data_00[2]._0_4_ = in_stack_ffffffffffffefa8;
          data_00[2]._4_4_ = in_stack_ffffffffffffefac;
          data_00[3] = (longlong)in_stack_ffffffffffffefb0;
          local_dc0 = uVar11;
          uStack_db8 = uVar14;
          uStack_db0 = uVar15;
          uStack_da8 = uVar17;
          local_9a0 = uVar15;
          uStack_998 = uVar17;
          local_990 = uVar11;
          uStack_988 = uVar14;
          convolve_lowbd_x_4tap(data_00,in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
          src[1] = (longlong)in_stack_ffffffffffffef80;
          src[0] = (longlong)in_RDI;
          src[2] = (longlong)in_stack_ffffffffffffef88;
          src[3] = (longlong)in_stack_ffffffffffffef90;
          local_de0 = uVar11;
          uStack_dd8 = uVar14;
          uStack_dd0 = uVar15;
          uStack_dc8 = uVar17;
          sr_x_round_avx2(src);
          auVar3._8_8_ = uVar14;
          auVar3._0_8_ = uVar11;
          auVar3._16_8_ = uVar15;
          auVar3._24_8_ = uVar17;
          auVar2._8_8_ = uVar14;
          auVar2._0_8_ = uVar11;
          auVar2._16_8_ = uVar15;
          auVar2._24_8_ = uVar17;
          local_e00 = vpackuswb_avx2(auVar3,auVar2);
          local_900 = local_e00._0_8_;
          uStack_8f8 = local_e00._8_8_;
          uStack_8f0 = local_e00._16_8_;
          uStack_8e8 = local_e00._24_8_;
          uStack_e08 = local_e00._24_8_;
          local_e10 = local_e00._16_8_;
          local_7c8 = (undefined8 *)((long)*local_a00 + (long)(local_d84 * local_a04));
          *local_7c8 = local_e00._16_8_;
          local_7e8 = (undefined8 *)((long)*local_a00 + (long)(local_d84 * local_a04 + local_a04));
          *local_7e8 = local_e20;
          local_de0 = uVar11;
          uStack_dd8 = uVar14;
          uStack_dd0 = uVar15;
          uStack_dc8 = uVar17;
          local_980 = uVar11;
          uStack_978 = uVar14;
          uStack_970 = uVar15;
          uStack_968 = uVar17;
          local_960 = uVar11;
          uStack_958 = uVar14;
          uStack_950 = uVar15;
          uStack_948 = uVar17;
          local_7e0 = local_e10;
          uStack_7d8 = uStack_e08;
        }
      }
      else {
        prepare_coeffs_lowbd
                  (in_stack_ffffffffffffefa0,in_stack_ffffffffffffef9c,in_stack_ffffffffffffef90);
        local_758 = "";
        local_e60[0] = '\0';
        local_e60[1] = '\x01';
        local_e60[2] = '\x01';
        local_e60[3] = '\x02';
        local_e60[4] = '\x02';
        local_e60[5] = '\x03';
        local_e60[6] = '\x03';
        local_e60[7] = '\x04';
        auStack_e58[0] = '\x04';
        auStack_e58[1] = '\x05';
        auStack_e58[2] = '\x05';
        auStack_e58[3] = '\x06';
        auStack_e58[4] = '\x06';
        auStack_e58[5] = '\a';
        auStack_e58[6] = '\a';
        auStack_e58[7] = '\b';
        auStack_e50[0] = '\0';
        auStack_e50[1] = '\x01';
        auStack_e50[2] = '\x01';
        auStack_e50[3] = '\x02';
        auStack_e50[4] = '\x02';
        auStack_e50[5] = '\x03';
        auStack_e50[6] = '\x03';
        auStack_e50[7] = '\x04';
        auStack_e48[0] = '\x04';
        auStack_e48[1] = '\x05';
        auStack_e48[2] = '\x05';
        auStack_e48[3] = '\x06';
        auStack_e48[4] = '\x06';
        auStack_e48[5] = '\a';
        auStack_e48[6] = '\a';
        auStack_e48[7] = '\b';
        local_760 = 
        "\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n"
        ;
        local_e40[0] = '\x02';
        local_e40[1] = '\x03';
        local_e40[2] = '\x03';
        local_e40[3] = '\x04';
        local_e40[4] = '\x04';
        local_e40[5] = '\x05';
        local_e40[6] = '\x05';
        local_e40[7] = '\x06';
        auStack_e38[0] = '\x06';
        auStack_e38[1] = '\a';
        auStack_e38[2] = '\a';
        auStack_e38[3] = '\b';
        auStack_e38[4] = '\b';
        auStack_e38[5] = '\t';
        auStack_e38[6] = '\t';
        auStack_e38[7] = '\n';
        auStack_e30[0] = '\x02';
        auStack_e30[1] = '\x03';
        auStack_e30[2] = '\x03';
        auStack_e30[3] = '\x04';
        auStack_e30[4] = '\x04';
        auStack_e30[5] = '\x05';
        auStack_e30[6] = '\x05';
        auStack_e30[7] = '\x06';
        auStack_e28[0] = '\x06';
        auStack_e28[1] = '\a';
        auStack_e28[2] = '\a';
        auStack_e28[3] = '\b';
        auStack_e28[4] = '\b';
        auStack_e28[5] = '\t';
        auStack_e28[6] = '\t';
        auStack_e28[7] = '\n';
        for (local_e64 = 0; local_e64 < local_a0c; local_e64 = local_e64 + 1) {
          for (local_e68 = 0; local_e68 < local_a08; local_e68 = local_e68 + 0x10) {
            local_768 = (undefined1 (*) [32])(local_ce8 + (local_e64 * local_9f4 + local_e68));
            local_9a8 = (undefined1 (*) [16])(local_ce8 + (local_e68 + 8 + local_e64 * local_9f4));
            local_ea0._0_16_ = ZEXT116(0) * *local_9a8 + ZEXT116(1) * SUB3216(*local_768,0);
            local_ea0._16_16_ = ZEXT116(0) * SUB3216(*local_768,0x10) + ZEXT116(1) * *local_9a8;
            data_01[0]._4_4_ = in_stack_ffffffffffffef9c;
            data_01[0]._0_4_ = in_stack_ffffffffffffef98;
            data_01[1] = (longlong)in_stack_ffffffffffffefa0;
            data_01[2]._0_4_ = in_stack_ffffffffffffefa8;
            data_01[2]._4_4_ = in_stack_ffffffffffffefac;
            data_01[3] = (longlong)in_stack_ffffffffffffefb0;
            auVar12 = local_ea0._0_16_;
            auVar13 = local_ea0._16_16_;
            convolve_lowbd_x_4tap(data_01,in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
            src_00[1] = (longlong)in_stack_ffffffffffffef80;
            src_00[0] = (longlong)in_RDI;
            src_00[2] = (longlong)in_stack_ffffffffffffef88;
            src_00[3] = (longlong)in_stack_ffffffffffffef90;
            local_ec0 = auVar12;
            auStack_eb0 = auVar13;
            sr_x_round_avx2(src_00);
            auVar4._16_8_ = auVar13._0_8_;
            auVar4._0_16_ = auVar12;
            auVar4._24_8_ = auVar13._8_8_;
            auVar1._16_8_ = auVar13._0_8_;
            auVar1._0_16_ = auVar12;
            auVar1._24_8_ = auVar13._8_8_;
            auVar1 = vpackuswb_avx2(auVar4,auVar1);
            local_ee0 = vpermq_avx2(auVar1,0xd8);
            local_8e0 = local_ee0._0_8_;
            uStack_8d8 = local_ee0._8_8_;
            uStack_8d0 = local_ee0._16_8_;
            uStack_8c8 = local_ee0._24_8_;
            local_ef0 = local_ee0._0_8_;
            uStack_ee8 = local_ee0._8_8_;
            local_868 = (undefined8 *)((long)*local_a00 + (long)(local_e64 * local_a04 + local_e68))
            ;
            local_880 = local_ee0._0_8_;
            uStack_878 = local_ee0._8_8_;
            *local_868 = local_ee0._0_8_;
            local_868[1] = local_ee0._8_8_;
            local_ec0 = auVar12;
            auStack_eb0 = auVar13;
            local_940 = auVar12;
            auStack_930 = auVar13;
            local_920 = auVar12;
            auStack_910 = auVar13;
          }
        }
      }
    }
    else {
      local_f80[0] = '\0';
      local_f80[1] = '\x01';
      local_f80[2] = '\x01';
      local_f80[3] = '\x02';
      local_f80[4] = '\x02';
      local_f80[5] = '\x03';
      local_f80[6] = '\x03';
      local_f80[7] = '\x04';
      auStack_f78[0] = '\x04';
      auStack_f78[1] = '\x05';
      auStack_f78[2] = '\x05';
      auStack_f78[3] = '\x06';
      auStack_f78[4] = '\x06';
      auStack_f78[5] = '\a';
      auStack_f78[6] = '\a';
      auStack_f78[7] = '\b';
      auStack_f70[0] = '\0';
      auStack_f70[1] = '\x01';
      auStack_f70[2] = '\x01';
      auStack_f70[3] = '\x02';
      auStack_f70[4] = '\x02';
      auStack_f70[5] = '\x03';
      auStack_f70[6] = '\x03';
      auStack_f70[7] = '\x04';
      auStack_f68[0] = '\x04';
      auStack_f68[1] = '\x05';
      auStack_f68[2] = '\x05';
      auStack_f68[3] = '\x06';
      auStack_f68[4] = '\x06';
      auStack_f68[5] = '\a';
      auStack_f68[6] = '\a';
      auStack_f68[7] = '\b';
      local_f60[0] = '\x02';
      local_f60[1] = '\x03';
      local_f60[2] = '\x03';
      local_f60[3] = '\x04';
      local_f60[4] = '\x04';
      local_f60[5] = '\x05';
      local_f60[6] = '\x05';
      local_f60[7] = '\x06';
      auStack_f58[0] = '\x06';
      auStack_f58[1] = '\a';
      auStack_f58[2] = '\a';
      auStack_f58[3] = '\b';
      auStack_f58[4] = '\b';
      auStack_f58[5] = '\t';
      auStack_f58[6] = '\t';
      auStack_f58[7] = '\n';
      auStack_f50[0] = '\x02';
      auStack_f50[1] = '\x03';
      auStack_f50[2] = '\x03';
      auStack_f50[3] = '\x04';
      auStack_f50[4] = '\x04';
      auStack_f50[5] = '\x05';
      auStack_f50[6] = '\x05';
      auStack_f50[7] = '\x06';
      auStack_f48[0] = '\x06';
      auStack_f48[1] = '\a';
      auStack_f48[2] = '\a';
      auStack_f48[3] = '\b';
      auStack_f48[4] = '\b';
      auStack_f48[5] = '\t';
      auStack_f48[6] = '\t';
      auStack_f48[7] = '\n';
      local_f40[0] = '\x04';
      local_f40[1] = '\x05';
      local_f40[2] = '\x05';
      local_f40[3] = '\x06';
      local_f40[4] = '\x06';
      local_f40[5] = '\a';
      local_f40[6] = '\a';
      local_f40[7] = '\b';
      auStack_f38[0] = '\b';
      auStack_f38[1] = '\t';
      auStack_f38[2] = '\t';
      auStack_f38[3] = '\n';
      auStack_f38[4] = '\n';
      auStack_f38[5] = '\v';
      auStack_f38[6] = '\v';
      auStack_f38[7] = '\f';
      auStack_f30[0] = '\x04';
      auStack_f30[1] = '\x05';
      auStack_f30[2] = '\x05';
      auStack_f30[3] = '\x06';
      auStack_f30[4] = '\x06';
      auStack_f30[5] = '\a';
      auStack_f30[6] = '\a';
      auStack_f30[7] = '\b';
      auStack_f28[0] = '\b';
      auStack_f28[1] = '\t';
      auStack_f28[2] = '\t';
      auStack_f28[3] = '\n';
      auStack_f28[4] = '\n';
      auStack_f28[5] = '\v';
      auStack_f28[6] = '\v';
      auStack_f28[7] = '\f';
      if (local_b04 == 6) {
        prepare_half_coeffs_6tap_avx2
                  ((InterpFilterParams *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),subpel_q4,
                   (__m256i *)CONCAT44(in_ECX,in_R8D));
        if (local_a08 == 8) {
          do {
            x_convolve_6tap_8x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffef80,(ptrdiff_t)in_RDI,
                       (__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),in_RDX);
            res_01[1] = (longlong)in_stack_ffffffffffffef80;
            res_01[0] = (longlong)in_RDI;
            res_01[2] = (longlong)in_stack_ffffffffffffef88;
            res_01[3] = (longlong)in_stack_ffffffffffffef90;
            sr_x_round_store_8x2_avx2
                      (res_01,(uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),
                       (ptrdiff_t)in_RDX);
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x10) {
          do {
            x_convolve_6tap_16x2_avx2
                      ((uint8_t *)CONCAT44(in_R9D,iVar5),
                       (int32_t)((ulong)in_stack_ffffffffffffef50 >> 0x20),
                       (__m256i *)CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48),
                       in_stack_ffffffffffffef40,(__m256i *)0x9b52b9);
            sr_x_round_store_16x2_avx2
                      ((__m256i *)in_stack_ffffffffffffefa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                       (ptrdiff_t)in_stack_ffffffffffffef90);
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x20) {
          do {
            sr_x_6tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              in_stack_ffffffffffffef90,(uint8_t *)in_stack_ffffffffffffef88);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x40) {
          do {
            sr_x_6tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              in_stack_ffffffffffffef90,(uint8_t *)in_stack_ffffffffffffef88);
            sr_x_6tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              in_stack_ffffffffffffef90,(uint8_t *)in_stack_ffffffffffffef88);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
        else {
          do {
            sr_x_6tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              in_stack_ffffffffffffef90,(uint8_t *)in_stack_ffffffffffffef88);
            sr_x_6tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              in_stack_ffffffffffffef90,(uint8_t *)in_stack_ffffffffffffef88);
            sr_x_6tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              in_stack_ffffffffffffef90,(uint8_t *)in_stack_ffffffffffffef88);
            sr_x_6tap_32_avx2((uint8_t *)in_stack_ffffffffffffefa0,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                              in_stack_ffffffffffffef90,(uint8_t *)in_stack_ffffffffffffef88);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
      }
      else if (local_b04 == 8) {
        local_1008 = (undefined8 *)(local_9f0[-1] + 0xd);
        res_03 = (__m256i *)0xa09090808070706;
        auStack_f18[0] = '\n';
        auStack_f18[1] = '\v';
        auStack_f18[2] = '\v';
        auStack_f18[3] = '\f';
        auStack_f18[4] = '\f';
        auStack_f18[5] = '\r';
        auStack_f18[6] = '\r';
        auStack_f18[7] = '\x0e';
        auStack_f10[0] = '\x06';
        auStack_f10[1] = '\a';
        auStack_f10[2] = '\a';
        auStack_f10[3] = '\b';
        auStack_f10[4] = '\b';
        auStack_f10[5] = '\t';
        auStack_f10[6] = '\t';
        auStack_f10[7] = '\n';
        auStack_f08[0] = '\n';
        auStack_f08[1] = '\v';
        auStack_f08[2] = '\v';
        auStack_f08[3] = '\f';
        auStack_f08[4] = '\f';
        auStack_f08[5] = '\r';
        auStack_f08[6] = '\r';
        auStack_f08[7] = '\x0e';
        pVar16 = 0;
        uVar11 = 0;
        local_f20 = res_03;
        prepare_half_coeffs_8tap_avx2
                  ((InterpFilterParams *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),subpel_q4,
                   (__m256i *)CONCAT44(in_ECX,in_R8D));
        if (local_a08 == 8) {
          do {
            x_convolve_8tap_8x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffef80,(ptrdiff_t)in_RDI,
                       (__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),in_RDX);
            res_02[1] = (longlong)in_stack_ffffffffffffef80;
            res_02[0] = (longlong)in_RDI;
            res_02[2] = (longlong)in_stack_ffffffffffffef88;
            res_02[3] = (longlong)in_stack_ffffffffffffef90;
            sr_x_round_store_8x2_avx2
                      (res_02,(uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),
                       (ptrdiff_t)in_RDX);
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x10) {
          do {
            x_convolve_8tap_8x2_avx2
                      ((uint8_t *)in_stack_ffffffffffffef80,(ptrdiff_t)in_RDI,
                       (__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),in_RDX);
            uVar19 = (undefined4)((ulong)uVar11 >> 0x20);
            uVar6 = (undefined4)uVar11;
            in_stack_ffffffffffffef80 = res_03;
            dst_stride = pVar16;
            x_convolve_8tap_8x2_avx2
                      ((uint8_t *)res_03,(ptrdiff_t)in_RDI,
                       (__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffef70),in_RDX);
            pVar16 = 0;
            uVar11 = 0;
            sr_x_round_store_16x2_avx2(res_03,(uint8_t *)CONCAT44(uVar19,uVar6),dst_stride);
            local_a00 = (__m256i *)((long)*local_a00 + (long)(local_a04 << 1));
            local_a2c = local_a2c + -2;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x20) {
          do {
            local_5e8 = local_1008;
            local_5f0 = local_b00;
            local_5f8 = local_f80;
            local_600 = local_a00;
            local_48 = local_1008;
            local_60 = local_640;
            local_38 = local_1008;
            uVar11 = *local_1008;
            uVar14 = local_1008[1];
            uVar15 = local_1008[2];
            uVar17 = local_1008[3];
            local_40 = local_1008 + 1;
            local_a0 = *local_40;
            uStack_98 = local_1008[2];
            uStack_90 = local_1008[3];
            uStack_88 = local_1008[4];
            data_02[1] = in_stack_ffffffffffffefe0._0_8_;
            data_02[2] = in_stack_ffffffffffffefe0._8_8_;
            data_02[3] = in_stack_ffffffffffffefe0._16_8_;
            data_02[0] = in_stack_ffffffffffffefd8;
            local_80 = uVar11;
            uStack_78 = uVar14;
            uStack_70 = uVar15;
            uStack_68 = uVar17;
            local_58 = local_5f8;
            local_50 = local_5f0;
            x_convolve_8tap_avx2(data_02,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_60;
            *local_60 = uVar11;
            puVar7[1] = uVar14;
            puVar7[2] = uVar15;
            puVar7[3] = uVar17;
            data_03[1] = in_stack_ffffffffffffefe0._0_8_;
            data_03[2] = in_stack_ffffffffffffefe0._8_8_;
            data_03[3] = in_stack_ffffffffffffefe0._16_8_;
            data_03[0] = in_stack_ffffffffffffefd8;
            uVar11 = local_a0;
            uVar14 = uStack_98;
            uVar15 = uStack_90;
            uVar17 = uStack_88;
            x_convolve_8tap_avx2(data_03,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_60;
            local_60[4] = uVar11;
            puVar7[5] = uVar14;
            puVar7[6] = uVar15;
            puVar7[7] = uVar17;
            sr_x_round_store_32_avx2(in_stack_ffffffffffffef80,(uint8_t *)in_RDI);
            local_1008 = (undefined8 *)((long)local_1008 + (long)local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
        else if (local_a08 == 0x40) {
          do {
            local_528 = local_1008;
            local_530 = local_b00;
            local_538 = local_f80;
            local_540 = local_a00;
            local_138 = local_1008;
            local_150 = local_580;
            local_128 = local_1008;
            uVar11 = *local_1008;
            uVar14 = local_1008[1];
            uVar15 = local_1008[2];
            uVar17 = local_1008[3];
            local_130 = local_1008 + 1;
            local_1a0 = *local_130;
            uStack_198 = local_1008[2];
            uStack_190 = local_1008[3];
            uStack_188 = local_1008[4];
            data_04[1] = in_stack_ffffffffffffefe0._0_8_;
            data_04[2] = in_stack_ffffffffffffefe0._8_8_;
            data_04[3] = in_stack_ffffffffffffefe0._16_8_;
            data_04[0] = in_stack_ffffffffffffefd8;
            local_180 = uVar11;
            uStack_178 = uVar14;
            uStack_170 = uVar15;
            uStack_168 = uVar17;
            local_148 = local_538;
            local_140 = local_530;
            x_convolve_8tap_avx2(data_04,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_150;
            *local_150 = uVar11;
            puVar7[1] = uVar14;
            puVar7[2] = uVar15;
            puVar7[3] = uVar17;
            data_05[1] = in_stack_ffffffffffffefe0._0_8_;
            data_05[2] = in_stack_ffffffffffffefe0._8_8_;
            data_05[3] = in_stack_ffffffffffffefe0._16_8_;
            data_05[0] = in_stack_ffffffffffffefd8;
            uVar11 = local_1a0;
            uVar14 = uStack_198;
            uVar15 = uStack_190;
            uVar17 = uStack_188;
            x_convolve_8tap_avx2(data_05,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_150;
            local_150[4] = uVar11;
            puVar7[5] = uVar14;
            puVar7[6] = uVar15;
            puVar7[7] = uVar17;
            sr_x_round_store_32_avx2(in_stack_ffffffffffffef80,(uint8_t *)in_RDI);
            local_588 = local_1008 + 4;
            local_5a0 = local_a00 + 1;
            local_590 = local_b00;
            local_598 = local_f80;
            local_d0 = local_5e0;
            uVar11 = *local_588;
            uVar14 = local_1008[5];
            uVar15 = local_1008[6];
            uVar17 = local_1008[7];
            local_b0 = local_1008 + 5;
            local_120 = *local_b0;
            uStack_118 = local_1008[6];
            uStack_110 = local_1008[7];
            uStack_108 = local_1008[8];
            data_06[1] = in_stack_ffffffffffffefe0._0_8_;
            data_06[2] = in_stack_ffffffffffffefe0._8_8_;
            data_06[3] = in_stack_ffffffffffffefe0._16_8_;
            data_06[0] = in_stack_ffffffffffffefd8;
            local_100 = uVar11;
            uStack_f8 = uVar14;
            uStack_f0 = uVar15;
            uStack_e8 = uVar17;
            local_c8 = local_598;
            local_c0 = local_590;
            local_b8 = local_588;
            local_a8 = local_588;
            x_convolve_8tap_avx2(data_06,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_d0;
            *local_d0 = uVar11;
            puVar7[1] = uVar14;
            puVar7[2] = uVar15;
            puVar7[3] = uVar17;
            data_07[1] = in_stack_ffffffffffffefe0._0_8_;
            data_07[2] = in_stack_ffffffffffffefe0._8_8_;
            data_07[3] = in_stack_ffffffffffffefe0._16_8_;
            data_07[0] = in_stack_ffffffffffffefd8;
            uVar11 = local_120;
            uVar14 = uStack_118;
            uVar15 = uStack_110;
            uVar17 = uStack_108;
            x_convolve_8tap_avx2(data_07,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_d0;
            local_d0[4] = uVar11;
            puVar7[5] = uVar14;
            puVar7[6] = uVar15;
            puVar7[7] = uVar17;
            sr_x_round_store_32_avx2(in_stack_ffffffffffffef80,(uint8_t *)in_RDI);
            local_1008 = (undefined8 *)((long)local_1008 + (long)local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
        else {
          do {
            local_3a8 = local_1008;
            local_3b0 = local_b00;
            local_3b8 = local_f80;
            local_3c0 = local_a00;
            local_338 = local_1008;
            local_350 = local_400;
            local_328 = local_1008;
            uVar11 = *local_1008;
            uVar14 = local_1008[1];
            uVar15 = local_1008[2];
            uVar17 = local_1008[3];
            local_330 = local_1008 + 1;
            local_3a0 = *local_330;
            uStack_398 = local_1008[2];
            uStack_390 = local_1008[3];
            uStack_388 = local_1008[4];
            data_08[1] = in_stack_ffffffffffffefe0._0_8_;
            data_08[2] = in_stack_ffffffffffffefe0._8_8_;
            data_08[3] = in_stack_ffffffffffffefe0._16_8_;
            data_08[0] = in_stack_ffffffffffffefd8;
            local_380 = uVar11;
            uStack_378 = uVar14;
            uStack_370 = uVar15;
            uStack_368 = uVar17;
            local_348 = local_3b8;
            local_340 = local_3b0;
            x_convolve_8tap_avx2(data_08,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_350;
            *local_350 = uVar11;
            puVar7[1] = uVar14;
            puVar7[2] = uVar15;
            puVar7[3] = uVar17;
            data_09[1] = in_stack_ffffffffffffefe0._0_8_;
            data_09[2] = in_stack_ffffffffffffefe0._8_8_;
            data_09[3] = in_stack_ffffffffffffefe0._16_8_;
            data_09[0] = in_stack_ffffffffffffefd8;
            uVar11 = local_3a0;
            uVar14 = uStack_398;
            uVar15 = uStack_390;
            uVar17 = uStack_388;
            x_convolve_8tap_avx2(data_09,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_350;
            local_350[4] = uVar11;
            puVar7[5] = uVar14;
            puVar7[6] = uVar15;
            puVar7[7] = uVar17;
            sr_x_round_store_32_avx2(in_stack_ffffffffffffef80,(uint8_t *)in_RDI);
            local_408 = local_1008 + 4;
            local_420 = local_a00 + 1;
            local_410 = local_b00;
            local_418 = local_f80;
            local_2d0 = local_460;
            uVar11 = *local_408;
            uVar14 = local_1008[5];
            uVar15 = local_1008[6];
            uVar17 = local_1008[7];
            local_2b0 = local_1008 + 5;
            local_320 = *local_2b0;
            uStack_318 = local_1008[6];
            uStack_310 = local_1008[7];
            uStack_308 = local_1008[8];
            data_10[1] = in_stack_ffffffffffffefe0._0_8_;
            data_10[2] = in_stack_ffffffffffffefe0._8_8_;
            data_10[3] = in_stack_ffffffffffffefe0._16_8_;
            data_10[0] = in_stack_ffffffffffffefd8;
            local_300 = uVar11;
            uStack_2f8 = uVar14;
            uStack_2f0 = uVar15;
            uStack_2e8 = uVar17;
            local_2c8 = local_418;
            local_2c0 = local_410;
            local_2b8 = local_408;
            local_2a8 = local_408;
            x_convolve_8tap_avx2(data_10,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_2d0;
            *local_2d0 = uVar11;
            puVar7[1] = uVar14;
            puVar7[2] = uVar15;
            puVar7[3] = uVar17;
            data_11[1] = in_stack_ffffffffffffefe0._0_8_;
            data_11[2] = in_stack_ffffffffffffefe0._8_8_;
            data_11[3] = in_stack_ffffffffffffefe0._16_8_;
            data_11[0] = in_stack_ffffffffffffefd8;
            uVar11 = local_320;
            uVar14 = uStack_318;
            uVar15 = uStack_310;
            uVar17 = uStack_308;
            x_convolve_8tap_avx2(data_11,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_2d0;
            local_2d0[4] = uVar11;
            puVar7[5] = uVar14;
            puVar7[6] = uVar15;
            puVar7[7] = uVar17;
            sr_x_round_store_32_avx2(in_stack_ffffffffffffef80,(uint8_t *)in_RDI);
            local_468 = local_1008 + 8;
            local_480 = local_a00 + 2;
            local_470 = local_b00;
            local_478 = local_f80;
            local_250 = local_4c0;
            uVar11 = *local_468;
            uVar14 = local_1008[9];
            uVar15 = local_1008[10];
            uVar17 = local_1008[0xb];
            local_230 = local_1008 + 9;
            local_2a0 = *local_230;
            uStack_298 = local_1008[10];
            uStack_290 = local_1008[0xb];
            uStack_288 = local_1008[0xc];
            data_12[1] = in_stack_ffffffffffffefe0._0_8_;
            data_12[2] = in_stack_ffffffffffffefe0._8_8_;
            data_12[3] = in_stack_ffffffffffffefe0._16_8_;
            data_12[0] = in_stack_ffffffffffffefd8;
            local_280 = uVar11;
            uStack_278 = uVar14;
            uStack_270 = uVar15;
            uStack_268 = uVar17;
            local_248 = local_478;
            local_240 = local_470;
            local_238 = local_468;
            local_228 = local_468;
            x_convolve_8tap_avx2(data_12,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_250;
            *local_250 = uVar11;
            puVar7[1] = uVar14;
            puVar7[2] = uVar15;
            puVar7[3] = uVar17;
            data_13[1] = in_stack_ffffffffffffefe0._0_8_;
            data_13[2] = in_stack_ffffffffffffefe0._8_8_;
            data_13[3] = in_stack_ffffffffffffefe0._16_8_;
            data_13[0] = in_stack_ffffffffffffefd8;
            uVar11 = local_2a0;
            uVar14 = uStack_298;
            uVar15 = uStack_290;
            uVar17 = uStack_288;
            x_convolve_8tap_avx2(data_13,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_250;
            local_250[4] = uVar11;
            puVar7[5] = uVar14;
            puVar7[6] = uVar15;
            puVar7[7] = uVar17;
            sr_x_round_store_32_avx2(in_stack_ffffffffffffef80,(uint8_t *)in_RDI);
            local_4c8 = local_1008 + 0xc;
            local_4e0 = local_a00 + 3;
            local_4d0 = local_b00;
            local_4d8 = local_f80;
            local_1d0 = local_520;
            uVar11 = *local_4c8;
            uVar14 = local_1008[0xd];
            uVar15 = local_1008[0xe];
            uVar17 = local_1008[0xf];
            local_1b0 = local_1008 + 0xd;
            local_220 = *local_1b0;
            uStack_218 = local_1008[0xe];
            uStack_210 = local_1008[0xf];
            uStack_208 = local_1008[0x10];
            data_14[1] = in_stack_ffffffffffffefe0._0_8_;
            data_14[2] = in_stack_ffffffffffffefe0._8_8_;
            data_14[3] = in_stack_ffffffffffffefe0._16_8_;
            data_14[0] = in_stack_ffffffffffffefd8;
            local_200 = uVar11;
            uStack_1f8 = uVar14;
            uStack_1f0 = uVar15;
            uStack_1e8 = uVar17;
            local_1c8 = local_4d8;
            local_1c0 = local_4d0;
            local_1b8 = local_4c8;
            local_1a8 = local_4c8;
            x_convolve_8tap_avx2(data_14,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_1d0;
            *local_1d0 = uVar11;
            puVar7[1] = uVar14;
            puVar7[2] = uVar15;
            puVar7[3] = uVar17;
            data_15[1] = in_stack_ffffffffffffefe0._0_8_;
            data_15[2] = in_stack_ffffffffffffefe0._8_8_;
            data_15[3] = in_stack_ffffffffffffefe0._16_8_;
            data_15[0] = in_stack_ffffffffffffefd8;
            uVar11 = local_220;
            uVar14 = uStack_218;
            uVar15 = uStack_210;
            uVar17 = uStack_208;
            x_convolve_8tap_avx2(data_15,in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            puVar7 = local_1d0;
            local_1d0[4] = uVar11;
            puVar7[5] = uVar14;
            puVar7[6] = uVar15;
            puVar7[7] = uVar17;
            sr_x_round_store_32_avx2(in_stack_ffffffffffffef80,(uint8_t *)in_RDI);
            local_1008 = (undefined8 *)((long)local_1008 + (long)local_9f4);
            local_a00 = (__m256i *)((long)*local_a00 + (long)local_a04);
            local_a2c = local_a2c + -1;
          } while (local_a2c != 0);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_convolve_x_sr_avx2(const uint8_t *src, int32_t src_stride,
                            uint8_t *dst, int32_t dst_stride, int32_t w,
                            int32_t h,
                            const InterpFilterParams *filter_params_x,
                            const int32_t subpel_x_qn,
                            ConvolveParams *conv_params) {
#if CONFIG_SVT_AV1
  const int horz_tap = get_filter_tap(filter_params_x, subpel_x_qn);

  if (horz_tap == 12) {
    av1_convolve_x_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_x, subpel_x_qn, conv_params);
  } else {
    av1_convolve_x_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                       filter_params_x, subpel_x_qn,
                                       conv_params);
  }
#else
  av1_convolve_x_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_x, subpel_x_qn, conv_params);
#endif
}